

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.h
# Opt level: O2

bool __thiscall ASDCP::MXF::ci_comp::operator()(ci_comp *this,string *a,string *b)

{
  bool bVar1;
  string sStack_98;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_78,(string *)a);
  to_lower(&local_58,&local_78);
  std::__cxx11::string::string((string *)&sStack_98,(string *)b);
  to_lower(&local_38,&sStack_98);
  bVar1 = std::operator<(&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&sStack_98);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return bVar1;
}

Assistant:

inline bool operator()(const std::string& a, const std::string& b) const {
	  return to_lower(a) < to_lower(b);
	}